

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O1

void setMarks(void)

{
  ostream *poVar1;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> temp;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> local_60;
  double local_48 [5];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_20;
  
  local_48[2] = 3.0;
  local_48[3] = 2.0;
  local_48[0] = 1.0;
  local_48[1] = 4.0;
  __l._M_len = 4;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__l,&local_61);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,&local_60);
  local_48[2] = 5.0;
  local_48[3] = 6.0;
  local_48[0] = 4.0;
  local_48[1] = 2.0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&local_60,local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,&local_60);
  local_48[2] = 4.0;
  local_48[3] = 5.0;
  local_48[0] = 3.0;
  local_48[1] = 8.0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&local_60,local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,&local_60);
  local_48[2] = 7.0;
  local_48[3] = 8.0;
  local_48[0] = 9.0;
  local_48[1] = 5.0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&local_60,local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&marks,&local_60);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  poVar1 = (ostream *)std::ostream::flush();
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"MATRIX ASSESSMENTS",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_20,&marks);
  printMatrix(&local_20);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_20);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void setMarks(){
    //Suzuki
    vector<double> temp={1,4,3,2};
    marks.push_back(temp);
    //Mitsubishi
    temp={4,2,5,6};
    marks.push_back(temp);
    //Honda
    temp={3,8,4,5};
    marks.push_back(temp);
    //Toyota
    temp={9,5,7,8};
    marks.push_back(temp);

    cout << endl << setw(10) << "MATRIX ASSESSMENTS" << endl;
    printMatrix(marks);
}